

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_uuencode.c
# Opt level: O0

int archive_filter_uuencode_write(archive_write_filter *f,void *buff,size_t length)

{
  uchar uVar1;
  void *pvVar2;
  long lVar3;
  int local_3c;
  uchar *puStack_38;
  int ret;
  uchar *p;
  private_uuencode *state;
  size_t length_local;
  void *buff_local;
  archive_write_filter *f_local;
  
  pvVar2 = f->data;
  local_3c = 0;
  if (length == 0) {
    f_local._4_4_ = 0;
  }
  else {
    puStack_38 = (uchar *)buff;
    state = (private_uuencode *)length;
    if (*(long *)((long)pvVar2 + 0x40) != 0) {
      for (; *(ulong *)((long)pvVar2 + 0x40) < 0x2d && state != (private_uuencode *)0x0;
          state = (private_uuencode *)&state[-1].field_0x77) {
        uVar1 = *puStack_38;
        lVar3 = *(long *)((long)pvVar2 + 0x40);
        *(long *)((long)pvVar2 + 0x40) = lVar3 + 1;
        *(uchar *)((long)pvVar2 + lVar3 + 0x48) = uVar1;
        puStack_38 = puStack_38 + 1;
      }
      if (*(ulong *)((long)pvVar2 + 0x40) < 0x2d) {
        return 0;
      }
      uu_encode((archive_string *)((long)pvVar2 + 0x20),(uchar *)((long)pvVar2 + 0x48),0x2d);
      *(undefined8 *)((long)pvVar2 + 0x40) = 0;
    }
    for (; (private_uuencode *)0x2c < state; state = (private_uuencode *)(state[-1].hold + 3)) {
      uu_encode((archive_string *)((long)pvVar2 + 0x20),puStack_38,0x2d);
      puStack_38 = puStack_38 + 0x2d;
    }
    if (state != (private_uuencode *)0x0) {
      memcpy((void *)((long)pvVar2 + 0x48),puStack_38,(size_t)state);
      *(private_uuencode **)((long)pvVar2 + 0x40) = state;
    }
    while (*(ulong *)((long)pvVar2 + 0x38) <= *(ulong *)((long)pvVar2 + 0x28)) {
      local_3c = __archive_write_filter
                           (f->next_filter,*(void **)((long)pvVar2 + 0x20),
                            *(size_t *)((long)pvVar2 + 0x38));
      memmove(*(void **)((long)pvVar2 + 0x20),
              (void *)(*(long *)((long)pvVar2 + 0x20) + *(long *)((long)pvVar2 + 0x38)),
              *(long *)((long)pvVar2 + 0x28) - *(long *)((long)pvVar2 + 0x38));
      *(long *)((long)pvVar2 + 0x28) =
           *(long *)((long)pvVar2 + 0x28) - *(long *)((long)pvVar2 + 0x38);
    }
    f_local._4_4_ = local_3c;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_filter_uuencode_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_uuencode *state = (struct private_uuencode *)f->data;
	const unsigned char *p = buff;
	int ret = ARCHIVE_OK;

	if (length == 0)
		return (ret);

	if (state->hold_len) {
		while (state->hold_len < LBYTES && length > 0) {
			state->hold[state->hold_len++] = *p++;
			length--;
		}
		if (state->hold_len < LBYTES)
			return (ret);
		uu_encode(&state->encoded_buff, state->hold, LBYTES);
		state->hold_len = 0;
	}

	for (; length >= LBYTES; length -= LBYTES, p += LBYTES)
		uu_encode(&state->encoded_buff, p, LBYTES);

	/* Save remaining bytes. */
	if (length > 0) {
		memcpy(state->hold, p, length);
		state->hold_len = length;
	}
	while (archive_strlen(&state->encoded_buff) >= state->bs) {
		ret = __archive_write_filter(f->next_filter,
		    state->encoded_buff.s, state->bs);
		memmove(state->encoded_buff.s,
		    state->encoded_buff.s + state->bs,
		    state->encoded_buff.length - state->bs);
		state->encoded_buff.length -= state->bs;
	}

	return (ret);
}